

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepScanLineBasic.cpp
# Opt level: O1

void anon_unknown.dwarf_10e49f::generateRandomFile
               (string *filename,int channelCount,Compression compression,bool bulkWrite)

{
  PixelType PVar1;
  int *piVar2;
  Array2D<void_*> *pAVar3;
  short sVar4;
  int iVar5;
  ostream *poVar6;
  ChannelList *pCVar7;
  void *pvVar8;
  void *pvVar9;
  int j;
  long lVar10;
  PixelType t;
  ulong size;
  uint uVar11;
  size_t spst;
  undefined1 in_R10B;
  int i_1;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  int j_2;
  long lVar15;
  int i;
  long lVar16;
  float fVar17;
  Array<Imf_2_5::Array2D<void_*>_> data;
  uif x;
  int type;
  undefined4 uStack_284;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  DeepScanLineOutputFile file;
  DeepFrameBuffer frameBuffer;
  stringstream ss;
  undefined1 local_1e0 [112];
  ios_base local_170 [264];
  DeepSlice local_68;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"generating ",0xb);
  std::ostream::flush();
  frameBuffer._map._M_t._M_impl._0_8_ = 0;
  Imf_2_5::Header::Header
            ((Header *)&ss,(Box2i *)(anonymous_namespace)::displayWindow,
             (Box2i *)&(anonymous_namespace)::dataWindow,1.0,(V2f *)&frameBuffer,1.0,INCREASING_Y,
             compression);
  Imf_2_5::Header::operator=((Header *)(anonymous_namespace)::header,(Header *)&ss);
  Imf_2_5::Header::~Header((Header *)&ss);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"compression ",0xc);
  poVar6 = (ostream *)std::ostream::operator<<(&std::cout,compression);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
  std::ostream::flush();
  if (DAT_0043e3f8._M_current != (anonymous_namespace)::channelTypes) {
    DAT_0043e3f8._M_current = (anonymous_namespace)::channelTypes;
  }
  if (0 < channelCount) {
    iVar12 = 0;
    do {
      type = random_int(3);
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      std::ostream::operator<<(local_1e0,iVar12);
      std::__cxx11::stringbuf::str();
      if (type == 0) {
        pCVar7 = Imf_2_5::Header::channels((Header *)(anonymous_namespace)::header);
        Imf_2_5::Channel::Channel((Channel *)&local_68,UINT,1,1,false);
        Imf_2_5::ChannelList::insert(pCVar7,(string *)&frameBuffer,(Channel *)&local_68);
      }
      if (type == 1) {
        pCVar7 = Imf_2_5::Header::channels((Header *)(anonymous_namespace)::header);
        Imf_2_5::Channel::Channel((Channel *)&local_68,HALF,1,1,false);
        Imf_2_5::ChannelList::insert(pCVar7,(string *)&frameBuffer,(Channel *)&local_68);
      }
      if (type == 2) {
        pCVar7 = Imf_2_5::Header::channels((Header *)(anonymous_namespace)::header);
        Imf_2_5::Channel::Channel((Channel *)&local_68,FLOAT,1,1,false);
        Imf_2_5::ChannelList::insert(pCVar7,(string *)&frameBuffer,(Channel *)&local_68);
      }
      if (DAT_0043e3f8._M_current == DAT_0043e400) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&(anonymous_namespace)::channelTypes,
                   DAT_0043e3f8,&type);
      }
      else {
        *DAT_0043e3f8._M_current = type;
        DAT_0043e3f8._M_current = DAT_0043e3f8._M_current + 1;
      }
      if ((_Base_ptr *)frameBuffer._map._M_t._M_impl._0_8_ !=
          &frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
        operator_delete((void *)frameBuffer._map._M_t._M_impl._0_8_,
                        (ulong)((long)&(frameBuffer._map._M_t._M_impl.super__Rb_tree_header.
                                        _M_header._M_parent)->_M_color + 1));
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      std::ios_base::~ios_base(local_170);
      iVar12 = iVar12 + 1;
    } while (channelCount != iVar12);
  }
  Imf_2_5::Header::setType
            ((Header *)(anonymous_namespace)::header,(string *)Imf_2_5::DEEPSCANLINE_abi_cxx11_);
  size = (ulong)(uint)channelCount;
  Imf_2_5::Array<Imf_2_5::Array2D<void_*>_>::Array(&data,size);
  if (0 < channelCount) {
    lVar15 = 0;
    do {
      pAVar3 = data._data;
      pvVar8 = operator_new__(0x5c3e8);
      pvVar9 = *(void **)((long)&pAVar3->_data + lVar15);
      if (pvVar9 != (void *)0x0) {
        operator_delete__(pvVar9);
      }
      *(undefined8 *)((long)&pAVar3->_sizeX + lVar15) = 0xad;
      *(undefined8 *)((long)&pAVar3->_sizeY + lVar15) = 0x111;
      *(void **)((long)&pAVar3->_data + lVar15) = pvVar8;
      lVar15 = lVar15 + 0x18;
    } while (size * 0x18 != lVar15);
  }
  pvVar9 = operator_new__(0x2e1f4);
  if ((anonymous_namespace)::sampleCount._16_8_ != 0) {
    operator_delete__((void *)(anonymous_namespace)::sampleCount._16_8_);
  }
  (anonymous_namespace)::sampleCount._0_8_ = 0xad;
  (anonymous_namespace)::sampleCount._8_8_ = 0x111;
  (anonymous_namespace)::sampleCount._16_8_ = pvVar9;
  remove((filename->_M_dataplus)._M_p);
  Imf_2_5::DeepScanLineOutputFile::DeepScanLineOutputFile
            (&file,(filename->_M_dataplus)._M_p,(Header *)(anonymous_namespace)::header,8);
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Imf_2_5::Slice::Slice
            (&frameBuffer._sampleCounts,HALF,(char *)0x0,0,0,1,1,0.0,(bool)in_R10B,
             SUB81(frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left,0));
  Imf_2_5::Slice::Slice
            ((Slice *)&ss,UINT,
             (char *)((anonymous_namespace)::sampleCount._16_8_ +
                      (long)(anonymous_namespace)::dataWindow * -4 + (long)DAT_0043e3d4 * -0x444),4,
             0x444,1,1,0.0,(bool)in_R10B,(bool)((char)DAT_0043e3d4 * 'D'));
  Imf_2_5::DeepFrameBuffer::insertSampleCountSlice(&frameBuffer,(Slice *)&ss);
  if (0 < channelCount) {
    lVar15 = 0x10;
    uVar13 = 0;
    do {
      PVar1 = (anonymous_namespace)::channelTypes[uVar13];
      t = (uint)(PVar1 != UINT) * 3;
      if (PVar1 == HALF) {
        t = PVar1;
      }
      if (PVar1 == FLOAT) {
        t = PVar1;
      }
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      std::ostream::operator<<(local_1e0,(int)uVar13);
      std::__cxx11::stringbuf::str();
      iVar12 = (anonymous_namespace)::channelTypes[uVar13];
      spst = (ulong)(iVar12 == 0) << 2;
      if (iVar12 == 1) {
        spst = 2;
      }
      if (iVar12 == 2) {
        spst = 4;
      }
      Imf_2_5::DeepSlice::DeepSlice
                (&local_68,t,
                 (char *)(*(long *)((long)&(data._data)->_sizeX + lVar15) +
                          (long)(anonymous_namespace)::dataWindow * -8 + (long)DAT_0043e3d4 * -0x888
                         ),8,0x888,spst,1,1,0.0,false,false);
      Imf_2_5::DeepFrameBuffer::insert(&frameBuffer,(string *)&type,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(uStack_284,type) != &local_278) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(uStack_284,type),local_278._M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      std::ios_base::~ios_base(local_170);
      uVar13 = uVar13 + 1;
      lVar15 = lVar15 + 0x18;
    } while (size != uVar13);
  }
  Imf_2_5::DeepScanLineOutputFile::setFrameBuffer(&file,&frameBuffer);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing ",8);
  std::ostream::flush();
  if (bulkWrite) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"bulk ",5);
    std::ostream::flush();
    lVar15 = 0;
    do {
      iVar12 = (int)lVar15 * 0x111;
      lVar10 = 0;
      do {
        iVar5 = random_int(10);
        *(int *)((anonymous_namespace)::sampleCount._8_8_ * lVar15 * 4 +
                 (anonymous_namespace)::sampleCount._16_8_ + lVar10 * 4) = iVar5 + 1;
        if (0 < channelCount) {
          iVar5 = (int)lVar10;
          uVar11 = (uint)(iVar5 + iVar12) % 0x801;
          fVar17 = (float)uVar11;
          uVar13 = 0;
          do {
            if ((anonymous_namespace)::channelTypes[uVar13] == 0) {
              pvVar9 = operator_new__((ulong)*(uint *)((anonymous_namespace)::sampleCount._8_8_ *
                                                       lVar15 * 4 +
                                                       (anonymous_namespace)::sampleCount._16_8_ +
                                                      lVar10 * 4) << 2);
              data._data[uVar13]._data[data._data[uVar13]._sizeY * lVar15 + lVar10] = pvVar9;
            }
            if ((anonymous_namespace)::channelTypes[uVar13] == 1) {
              pvVar9 = operator_new__((ulong)*(uint *)((anonymous_namespace)::sampleCount._8_8_ *
                                                       lVar15 * 4 +
                                                       (anonymous_namespace)::sampleCount._16_8_ +
                                                      lVar10 * 4) * 2);
              data._data[uVar13]._data[data._data[uVar13]._sizeY * lVar15 + lVar10] = pvVar9;
            }
            if ((anonymous_namespace)::channelTypes[uVar13] == 2) {
              pvVar9 = operator_new__((ulong)*(uint *)((anonymous_namespace)::sampleCount._8_8_ *
                                                       lVar15 * 4 +
                                                       (anonymous_namespace)::sampleCount._16_8_ +
                                                      lVar10 * 4) << 2);
              data._data[uVar13]._data[data._data[uVar13]._sizeY * lVar15 + lVar10] = pvVar9;
            }
            if (*(int *)((anonymous_namespace)::sampleCount._8_8_ * lVar15 * 4 +
                         (anonymous_namespace)::sampleCount._16_8_ + lVar10 * 4) != 0) {
              uVar14 = 0;
              do {
                piVar2 = (anonymous_namespace)::channelTypes;
                if ((anonymous_namespace)::channelTypes[uVar13] == 0) {
                  *(uint *)((long)data._data[uVar13]._data
                                  [data._data[uVar13]._sizeY * lVar15 + lVar10] + uVar14 * 4) =
                       (uint)(iVar5 + iVar12) % 0x801;
                }
                if (piVar2[uVar13] == 1) {
                  pvVar9 = data._data[uVar13]._data[data._data[uVar13]._sizeY * lVar15 + lVar10];
                  sVar4 = (short)((uint)fVar17 >> 0x10);
                  if (uVar11 != 0) {
                    sVar4 = *(short *)((long)&half::_eLut + (ulong)((uint)fVar17 >> 0x17) * 2);
                    if (sVar4 == 0) {
                      sVar4 = half::convert((int)fVar17);
                    }
                    else {
                      sVar4 = sVar4 + (short)(((uint)fVar17 & 0x7fffff) + 0xfff +
                                              (uint)(((uint)fVar17 >> 0xd & 1) != 0) >> 0xd);
                    }
                  }
                  *(short *)((long)pvVar9 + uVar14 * 2) = sVar4;
                }
                if ((anonymous_namespace)::channelTypes[uVar13] == 2) {
                  *(float *)((long)data._data[uVar13]._data
                                   [data._data[uVar13]._sizeY * lVar15 + lVar10] + uVar14 * 4) =
                       (float)((uint)(iVar12 + iVar5) % 0x801);
                }
                uVar14 = uVar14 + 1;
              } while (uVar14 < *(uint *)((anonymous_namespace)::sampleCount._8_8_ * lVar15 * 4 +
                                          (anonymous_namespace)::sampleCount._16_8_ + lVar10 * 4));
            }
            uVar13 = uVar13 + 1;
          } while (uVar13 != size);
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0x111);
      lVar15 = lVar15 + 1;
    } while (lVar15 != 0xad);
    Imf_2_5::DeepScanLineOutputFile::writePixels(&file,0xad);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"per-line ",9);
    std::ostream::flush();
    lVar15 = 0;
    do {
      iVar12 = (int)lVar15 * 0x111;
      lVar10 = 0;
      do {
        iVar5 = random_int(10);
        *(int *)((anonymous_namespace)::sampleCount._8_8_ * lVar15 * 4 +
                 (anonymous_namespace)::sampleCount._16_8_ + lVar10 * 4) = iVar5 + 1;
        if (0 < channelCount) {
          iVar5 = (int)lVar10;
          uVar11 = (uint)(iVar5 + iVar12) % 0x801;
          fVar17 = (float)uVar11;
          uVar13 = 0;
          do {
            if ((anonymous_namespace)::channelTypes[uVar13] == 0) {
              pvVar9 = operator_new__((ulong)*(uint *)((anonymous_namespace)::sampleCount._8_8_ *
                                                       lVar15 * 4 +
                                                       (anonymous_namespace)::sampleCount._16_8_ +
                                                      lVar10 * 4) << 2);
              data._data[uVar13]._data[data._data[uVar13]._sizeY * lVar15 + lVar10] = pvVar9;
            }
            if ((anonymous_namespace)::channelTypes[uVar13] == 1) {
              pvVar9 = operator_new__((ulong)*(uint *)((anonymous_namespace)::sampleCount._8_8_ *
                                                       lVar15 * 4 +
                                                       (anonymous_namespace)::sampleCount._16_8_ +
                                                      lVar10 * 4) * 2);
              data._data[uVar13]._data[data._data[uVar13]._sizeY * lVar15 + lVar10] = pvVar9;
            }
            if ((anonymous_namespace)::channelTypes[uVar13] == 2) {
              pvVar9 = operator_new__((ulong)*(uint *)((anonymous_namespace)::sampleCount._8_8_ *
                                                       lVar15 * 4 +
                                                       (anonymous_namespace)::sampleCount._16_8_ +
                                                      lVar10 * 4) << 2);
              data._data[uVar13]._data[data._data[uVar13]._sizeY * lVar15 + lVar10] = pvVar9;
            }
            if (*(int *)((anonymous_namespace)::sampleCount._8_8_ * lVar15 * 4 +
                         (anonymous_namespace)::sampleCount._16_8_ + lVar10 * 4) != 0) {
              uVar14 = 0;
              do {
                piVar2 = (anonymous_namespace)::channelTypes;
                if ((anonymous_namespace)::channelTypes[uVar13] == 0) {
                  *(uint *)((long)data._data[uVar13]._data
                                  [data._data[uVar13]._sizeY * lVar15 + lVar10] + uVar14 * 4) =
                       (uint)(iVar5 + iVar12) % 0x801;
                }
                if (piVar2[uVar13] == 1) {
                  pvVar9 = data._data[uVar13]._data[data._data[uVar13]._sizeY * lVar15 + lVar10];
                  sVar4 = (short)((uint)fVar17 >> 0x10);
                  if (uVar11 != 0) {
                    sVar4 = *(short *)((long)&half::_eLut + (ulong)((uint)fVar17 >> 0x17) * 2);
                    if (sVar4 == 0) {
                      sVar4 = half::convert((int)fVar17);
                    }
                    else {
                      sVar4 = sVar4 + (short)(((uint)fVar17 & 0x7fffff) + 0xfff +
                                              (uint)(((uint)fVar17 >> 0xd & 1) != 0) >> 0xd);
                    }
                  }
                  *(short *)((long)pvVar9 + uVar14 * 2) = sVar4;
                }
                if ((anonymous_namespace)::channelTypes[uVar13] == 2) {
                  *(float *)((long)data._data[uVar13]._data
                                   [data._data[uVar13]._sizeY * lVar15 + lVar10] + uVar14 * 4) =
                       (float)((uint)(iVar12 + iVar5) % 0x801);
                }
                uVar14 = uVar14 + 1;
              } while (uVar14 < *(uint *)((anonymous_namespace)::sampleCount._8_8_ * lVar15 * 4 +
                                          (anonymous_namespace)::sampleCount._16_8_ + lVar10 * 4));
            }
            uVar13 = uVar13 + 1;
          } while (uVar13 != size);
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0x111);
      Imf_2_5::DeepScanLineOutputFile::writePixels(&file,1);
      lVar15 = lVar15 + 1;
    } while (lVar15 != 0xad);
  }
  lVar15 = 0;
  do {
    lVar10 = 0;
    do {
      if (0 < channelCount) {
        lVar16 = 4;
        uVar13 = 0;
        do {
          if (((anonymous_namespace)::channelTypes[uVar13] == 0) &&
             (pvVar9 = *(void **)(*(long *)((long)data._data + lVar16 * 4 + -8) * lVar15 * 8 +
                                  *(long *)((long)&(data._data)->_sizeX + lVar16 * 4) + lVar10 * 8),
             pvVar9 != (void *)0x0)) {
            operator_delete__(pvVar9);
          }
          if (((anonymous_namespace)::channelTypes[uVar13] == 1) &&
             (pvVar9 = *(void **)(*(long *)((long)data._data + lVar16 * 4 + -8) * lVar15 * 8 +
                                  *(long *)((long)&(data._data)->_sizeX + lVar16 * 4) + lVar10 * 8),
             pvVar9 != (void *)0x0)) {
            operator_delete__(pvVar9);
          }
          if (((anonymous_namespace)::channelTypes[uVar13] == 2) &&
             (pvVar9 = *(void **)(*(long *)((long)data._data + lVar16 * 4 + -8) * lVar15 * 8 +
                                  *(long *)((long)&(data._data)->_sizeX + lVar16 * 4) + lVar10 * 8),
             pvVar9 != (void *)0x0)) {
            operator_delete__(pvVar9);
          }
          uVar13 = uVar13 + 1;
          lVar16 = lVar16 + 6;
        } while (size != uVar13);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x111);
    lVar15 = lVar15 + 1;
  } while (lVar15 != 0xad);
  std::
  _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>_>
               *)&frameBuffer);
  Imf_2_5::DeepScanLineOutputFile::~DeepScanLineOutputFile(&file);
  Imf_2_5::Array<Imf_2_5::Array2D<void_*>_>::~Array(&data);
  return;
}

Assistant:

void generateRandomFile (const std::string filename,
                         int channelCount,
                         Compression compression,
                         bool bulkWrite)
{
    cout << "generating " << flush;
    header = Header(displayWindow, dataWindow,
                    1,
                    IMATH_NAMESPACE::V2f (0, 0),
                    1,
                    INCREASING_Y,
                    compression);

    cout << "compression " << compression << " " << flush;

    //
    // Add channels.
    //

    channelTypes.clear();

    for (int i = 0; i < channelCount; i++)
    {
        int type = random_int(3);
        stringstream ss;
        ss << i;
        string str = ss.str();
        if (type == 0)
            header.channels().insert(str, Channel(IMF::UINT));
        if (type == 1)
            header.channels().insert(str, Channel(IMF::HALF));
        if (type == 2)
            header.channels().insert(str, Channel(IMF::FLOAT));
        channelTypes.push_back(type);
    }

    header.setType(DEEPSCANLINE);

    Array<Array2D< void* > > data(channelCount);
    for (int i = 0; i < channelCount; i++)
        data[i].resizeErase(height, width);

    sampleCount.resizeErase(height, width);

    remove (filename.c_str());
    DeepScanLineOutputFile file(filename.c_str(), header, 8);

    DeepFrameBuffer frameBuffer;

    frameBuffer.insertSampleCountSlice (Slice (IMF::UINT,                    // type // 7
                                        (char *) (&sampleCount[0][0]
                                                  - dataWindow.min.x
                                                  - dataWindow.min.y * width),  // base
                                        sizeof (unsigned int) * 1,          // xStride
                                        sizeof (unsigned int) * width));    // yStride

    for (int i = 0; i < channelCount; i++)
    {
        PixelType type = NUM_PIXELTYPES;
        if (channelTypes[i] == 0)
            type = IMF::UINT;
        if (channelTypes[i] == 1)
            type = IMF::HALF;
        if (channelTypes[i] == 2)
            type = IMF::FLOAT;

        stringstream ss;
        ss << i;
        string str = ss.str();

        int sampleSize = 0;
        if (channelTypes[i] == 0) sampleSize = sizeof (unsigned int);
        if (channelTypes[i] == 1) sampleSize = sizeof (half);
        if (channelTypes[i] == 2) sampleSize = sizeof (float);

        int pointerSize = sizeof(char *);

        frameBuffer.insert (str,                            // name // 6
                            DeepSlice (type,                    // type // 7
                            (char *) (&data[i][0][0]
                                      - dataWindow.min.x
                                      - dataWindow.min.y * width),               // base // 8
                            pointerSize * 1,          // xStride// 9
                            pointerSize * width,      // yStride// 10
                            sampleSize));             // sampleStride
    }

    file.setFrameBuffer(frameBuffer);

    cout << "writing " << flush;
    if (bulkWrite)
    {
        cout << "bulk " << flush;
        for (int i = 0; i < height; i++)
        {
            //
            // Fill in data at the last minute.
            //

            for (int j = 0; j < width; j++)
            {
                sampleCount[i][j] = random_int(10) + 1;
                for (int k = 0; k < channelCount; k++)
                {
                    if (channelTypes[k] == 0)
                        data[k][i][j] = new unsigned int[sampleCount[i][j]];
                    if (channelTypes[k] == 1)
                        data[k][i][j] = new half[sampleCount[i][j]];
                    if (channelTypes[k] == 2)
                        data[k][i][j] = new float[sampleCount[i][j]];
                    for (unsigned int l = 0; l < sampleCount[i][j]; l++)
                    {
                        if (channelTypes[k] == 0)
                            ((unsigned int*)data[k][i][j])[l] = (i * width + j) % 2049;
                        if (channelTypes[k] == 1)
                            ((half*)data[k][i][j])[l] = (i * width + j) % 2049;
                        if (channelTypes[k] == 2)
                            ((float*)data[k][i][j])[l] = (i * width + j) % 2049;
                    }
                }
            }
        }

        file.writePixels(height);
    }
    else
    {
        cout << "per-line " << flush;
        for (int i = 0; i < height; i++)
        {
            //
            // Fill in data at the last minute.
            //

            for (int j = 0; j < width; j++)
            {
                sampleCount[i][j] = random_int(10) + 1;
                for (int k = 0; k < channelCount; k++)
                {
                    if (channelTypes[k] == 0)
                        data[k][i][j] = new unsigned int[sampleCount[i][j]];
                    if (channelTypes[k] == 1)
                        data[k][i][j] = new half[sampleCount[i][j]];
                    if (channelTypes[k] == 2)
                        data[k][i][j] = new float[sampleCount[i][j]];
                    for (unsigned int l = 0; l < sampleCount[i][j]; l++)
                    {
                        if (channelTypes[k] == 0)
                            ((unsigned int*)data[k][i][j])[l] = (i * width + j) % 2049;
                        if (channelTypes[k] == 1)
                            ((half*)data[k][i][j])[l] = (i * width + j) % 2049;
                        if (channelTypes[k] == 2)
                            ((float*)data[k][i][j])[l] = (i * width + j) % 2049;
                    }
                }
            }
            file.writePixels(1);
        }
    }

    for (int i = 0; i < height; i++)
        for (int j = 0; j < width; j++)
            for (int k = 0; k < channelCount; k++)
            {
                if (channelTypes[k] == 0)
                    delete[] (unsigned int*) data[k][i][j];
                if (channelTypes[k] == 1)
                    delete[] (half*) data[k][i][j];
                if (channelTypes[k] == 2)
                    delete[] (float*) data[k][i][j];
            }
}